

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester_mq.c
# Opt level: O0

void tester_mq_send(mqd_t tester_mq,char *word,_Bool completed,size_t total_processed,_Bool ignored,
                   _Bool accepted,_Bool *err)

{
  size_t __n;
  undefined1 local_830 [8];
  size_t local_828;
  byte local_820;
  byte local_81f;
  undefined1 auStack_81e [1006];
  char local_430 [8];
  tester_mq_msg msg;
  int tmp_err;
  _Bool accepted_local;
  _Bool ignored_local;
  size_t total_processed_local;
  _Bool completed_local;
  char *word_local;
  mqd_t tester_mq_local;
  
  msg.word[0x3e6] = '\0';
  msg.word[999] = '\0';
  msg.word[1000] = '\0';
  msg._1019_1_ = 0;
  msg._1022_1_ = accepted;
  msg._1023_1_ = ignored;
  memset(local_430,0,0x400);
  local_820 = msg._1023_1_ & 1;
  local_81f = msg._1022_1_ & 1;
  local_830[0] = completed;
  local_828 = total_processed;
  memcpy(auStack_81e,"",0x3e9);
  memcpy(local_430,local_830,0x400);
  if (word != (char *)0x0) {
    __n = strlen(word);
    memcpy((void *)((long)&msg.total_processed + 2),word,__n);
  }
  msg._1016_4_ = mq_send(tester_mq,local_430,0x400,1);
  if (msg._1016_4_ == -1) {
    if (err != (_Bool *)0x0) {
      *err = true;
    }
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/tester_mq.c"
                  ,"tester_mq_send");
  }
  return;
}

Assistant:

void tester_mq_send(mqd_t tester_mq, const char *word, bool completed, size_t total_processed, bool ignored, bool accepted,
                    bool *err) {
    assert(err != NULL);

    int tmp_err = 0;
    tester_mq_msg msg;
    memset(&msg, 0, sizeof(tester_mq_msg)); // to prevent valgrind errors
    msg = (tester_mq_msg){completed, total_processed, ignored, accepted, ""};
    if(word != NULL) {
        memcpy(msg.word, word, strlen(word));
    }

    tmp_err = mq_send(tester_mq, (const char *)&msg, sizeof(tester_mq_msg), NORMAL_MQ_PRIORITY);
    VOID_FAIL_IF(tmp_err == -1);
}